

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O1

Boxed_Value __thiscall
chaiscript::detail::Dispatch_Engine::call_function
          (Dispatch_Engine *this,string_view t_name,atomic_uint_fast32_t *t_loc,
          Function_Params *params,Type_Conversions_State *t_conversions)

{
  Boxed_Value *t_hint;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  string_view t_name_00;
  Boxed_Value BVar2;
  Type_Conversions_State *in_stack_00000008;
  pair<unsigned_long,_std::shared_ptr<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>_>
  local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  
  t_name_00._M_len = t_name._M_str;
  t_hint = params->m_begin;
  t_name_00._M_str = (char *)t_loc;
  get_function(&local_48,(Dispatch_Engine *)t_name._M_len,t_name_00,(size_t)t_hint);
  if ((Boxed_Value *)local_48.first != t_hint) {
    LOCK();
    params->m_begin = (Boxed_Value *)local_48.first;
    UNLOCK();
  }
  BVar2 = dispatch::
          dispatch<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>>>
                    ((dispatch *)this,
                     local_48.second.
                     super___shared_ptr<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr,(Function_Params *)t_conversions,in_stack_00000008);
  _Var1._M_pi = BVar2.m_data.
                super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  if (local_48.second.
      super___shared_ptr<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.second.
               super___shared_ptr<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
    _Var1._M_pi = extraout_RDX;
  }
  BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var1._M_pi;
  BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Boxed_Value call_function(std::string_view t_name,
                                std::atomic_uint_fast32_t &t_loc,
                                const Function_Params &params,
                                const Type_Conversions_State &t_conversions) const {
        uint_fast32_t loc = t_loc;
        const auto [func_loc, func] = get_function(t_name, loc);
        if (func_loc != loc) {
          t_loc = uint_fast32_t(func_loc);
        }
        return dispatch::dispatch(*func, params, t_conversions);
      }